

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_plt
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,REF_BOOL as_brick,
          char *filename)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  char default_name [1000];
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT cell_id;
  float eohmarker;
  int numvar;
  int len;
  int i;
  int ascii [1024];
  undefined4 local_60;
  undefined4 local_5c;
  int filetype;
  int one;
  FILE *file;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char *filename_local;
  char **ppcStack_30;
  REF_BOOL as_brick_local;
  char **scalar_names_local;
  REF_DBL *scalar_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  file = (FILE *)ref_grid->node;
  _filetype = (FILE *)0x0;
  local_5c = 1;
  local_60 = 0;
  cell_id = ldim + 3;
  min_faceid = 0x43b28000;
  ref_mpi = (REF_MPI)filename;
  filename_local._4_4_ = as_brick;
  ppcStack_30 = scalar_names;
  scalar_names_local = (char **)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  if (0 < *(int *)&ref_node->age) {
    ref_mpi_stopwatch_stop((REF_MPI)ref_node,"reset timing");
  }
  ref_private_status_reis_ai._0_4_ = ref_node_synchronize_globals((REF_NODE)file);
  if ((uint)ref_private_status_reis_ai != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10a0
           ,"ref_gather_scalar_plt",(ulong)(uint)ref_private_status_reis_ai,"sync");
    return (uint)ref_private_status_reis_ai;
  }
  if (0 < *(int *)&ref_node->age) {
    ref_mpi_stopwatch_stop((REF_MPI)ref_node,"header sync global");
  }
  if (ref_node->max == 0) {
    _filetype = fopen((char *)ref_mpi,"w");
    if (_filetype == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_filetype == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10a7,"ref_gather_scalar_plt","unable to open file");
      return 2;
    }
    sVar2 = fwrite("#!TDV112",1,8,_filetype);
    if (sVar2 != 8) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10a9,"ref_gather_scalar_plt","header",8,sVar2);
      return 1;
    }
    sVar2 = fwrite(&local_5c,4,1,_filetype);
    if (sVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10aa,"ref_gather_scalar_plt","magic",1,sVar2);
      return 1;
    }
    sVar2 = fwrite(&local_60,4,1,_filetype);
    if (sVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10ab,"ref_gather_scalar_plt","filetype",1,sVar2);
      return 1;
    }
    len = 0x66;
    i = 0x74;
    ascii[0] = 0;
    sVar2 = fwrite(&len,4,3,_filetype);
    if (sVar2 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b0,"ref_gather_scalar_plt","title",3,sVar2);
      return 1;
    }
    sVar2 = fwrite(&cell_id,4,1,_filetype);
    if (sVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b2,"ref_gather_scalar_plt","numvar",1,sVar2);
      return 1;
    }
    len = 0x78;
    i = 0;
    sVar2 = fwrite(&len,4,2,_filetype);
    if (sVar2 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b5,"ref_gather_scalar_plt","var",2,sVar2);
      return 1;
    }
    len = 0x79;
    i = 0;
    sVar2 = fwrite(&len,4,2,_filetype);
    if (sVar2 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b8,"ref_gather_scalar_plt","var",2,sVar2);
      return 1;
    }
    len = 0x7a;
    i = 0;
    sVar2 = fwrite(&len,4,2,_filetype);
    if (sVar2 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10bb,"ref_gather_scalar_plt","var",2,sVar2);
      return 1;
    }
    for (numvar = 0; numvar < scalar_local._4_4_; numvar = numvar + 1) {
      eohmarker = 0.0;
      if (ppcStack_30 == (char **)0x0) {
        snprintf((char *)&ref_private_macro_code_rss_2,1000,"V%d",(ulong)(numvar + 1));
        uVar1 = ref_gather_plt_char_int
                          ((char *)&ref_private_macro_code_rss_2,0x400,(REF_INT *)&eohmarker,&len);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x10c1,"ref_gather_scalar_plt",(ulong)uVar1,"a2i");
          return uVar1;
        }
      }
      else {
        uVar1 = ref_gather_plt_char_int(ppcStack_30[numvar],0x400,(REF_INT *)&eohmarker,&len);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x10c3,"ref_gather_scalar_plt",(ulong)uVar1,"a2i");
          return uVar1;
        }
      }
      sVar2 = (size_t)(int)eohmarker;
      sVar3 = fwrite(&len,4,(long)(int)eohmarker,_filetype);
      if (sVar2 != sVar3) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10c5,"ref_gather_scalar_plt","var",sVar2,sVar3);
        return 1;
      }
    }
  }
  if (0 < *(int *)&ref_node->age) {
    ref_mpi_stopwatch_stop((REF_MPI)ref_node,"header vars");
  }
  uVar1 = ref_grid_faceid_range
                    (pRStack_18,&ref_private_macro_code_rss,
                     (REF_INT *)((long)&ref_private_status_reis_ai + 4));
  if (uVar1 == 0) {
    if (0 < *(int *)&ref_node->age) {
      ref_mpi_stopwatch_stop((REF_MPI)ref_node,"header faceid range");
    }
    for (max_faceid = ref_private_macro_code_rss; max_faceid <= ref_private_status_reis_ai._4_4_;
        max_faceid = max_faceid + 1) {
      uVar1 = ref_gather_plt_tri_header(pRStack_18,max_faceid,(FILE *)_filetype);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d0,"ref_gather_scalar_plt",(ulong)uVar1,"plt tri header");
        return uVar1;
      }
      uVar1 = ref_gather_plt_qua_header(pRStack_18,max_faceid,(FILE *)_filetype);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d1,"ref_gather_scalar_plt",(ulong)uVar1,"plt qua header");
        return uVar1;
      }
    }
    if (0 < *(int *)&ref_node->age) {
      ref_mpi_stopwatch_stop((REF_MPI)ref_node,"header surf");
    }
    if (filename_local._4_4_ == 0) {
      uVar1 = ref_gather_plt_tet_header(pRStack_18,(FILE *)_filetype);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d9,"ref_gather_scalar_plt",(ulong)uVar1,"plt tet header");
        return uVar1;
      }
    }
    else {
      uVar1 = ref_gather_plt_brick_header(pRStack_18,pRStack_18->cell[8],(FILE *)_filetype);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d7,"ref_gather_scalar_plt",(ulong)uVar1,"plt tet brick header");
        return uVar1;
      }
    }
    uVar1 = ref_gather_plt_brick_header(pRStack_18,pRStack_18->cell[9],(FILE *)_filetype);
    if (uVar1 == 0) {
      uVar1 = ref_gather_plt_brick_header(pRStack_18,pRStack_18->cell[10],(FILE *)_filetype);
      if (uVar1 == 0) {
        uVar1 = ref_gather_plt_brick_header(pRStack_18,pRStack_18->cell[0xb],(FILE *)_filetype);
        if (uVar1 == 0) {
          if (0 < *(int *)&ref_node->age) {
            ref_mpi_stopwatch_stop((REF_MPI)ref_node,"header vol");
          }
          if ((ref_node->max == 0) && (sVar2 = fwrite(&min_faceid,4,1,_filetype), sVar2 != 1)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x10e5,"ref_gather_scalar_plt","eohmarker",1,sVar2);
            ref_grid_local._4_4_ = 1;
          }
          else {
            if (0 < *(int *)&ref_node->age) {
              ref_mpi_stopwatch_stop((REF_MPI)ref_node,"plt end of header");
            }
            for (max_faceid = ref_private_macro_code_rss;
                max_faceid <= ref_private_status_reis_ai._4_4_; max_faceid = max_faceid + 1) {
              uVar1 = ref_gather_plt_tri_zone
                                (pRStack_18,max_faceid,scalar_local._4_4_,
                                 (REF_DBL *)scalar_names_local,(FILE *)_filetype);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x10ec,"ref_gather_scalar_plt",(ulong)uVar1,"plt tri zone");
                return uVar1;
              }
              uVar1 = ref_gather_plt_qua_zone
                                (pRStack_18,max_faceid,scalar_local._4_4_,
                                 (REF_DBL *)scalar_names_local,(FILE *)_filetype);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x10ee,"ref_gather_scalar_plt",(ulong)uVar1,"plt qua zone");
                return uVar1;
              }
            }
            if (0 < *(int *)&ref_node->age) {
              ref_mpi_stopwatch_stop((REF_MPI)ref_node,"surf zone");
            }
            if (filename_local._4_4_ == 0) {
              uVar1 = ref_gather_plt_tet_zone
                                (pRStack_18,scalar_local._4_4_,(REF_DBL *)scalar_names_local,
                                 (FILE *)_filetype);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x10f7,"ref_gather_scalar_plt",(ulong)uVar1,"surf zone");
                return uVar1;
              }
            }
            else {
              uVar1 = ref_gather_plt_brick_zone
                                (pRStack_18,pRStack_18->cell[8],scalar_local._4_4_,
                                 (REF_DBL *)scalar_names_local,(FILE *)_filetype);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x10f5,"ref_gather_scalar_plt",(ulong)uVar1,"plt tet brick zone");
                return uVar1;
              }
            }
            uVar1 = ref_gather_plt_brick_zone
                              (pRStack_18,pRStack_18->cell[9],scalar_local._4_4_,
                               (REF_DBL *)scalar_names_local,(FILE *)_filetype);
            if (uVar1 == 0) {
              uVar1 = ref_gather_plt_brick_zone
                                (pRStack_18,pRStack_18->cell[10],scalar_local._4_4_,
                                 (REF_DBL *)scalar_names_local,(FILE *)_filetype);
              if (uVar1 == 0) {
                uVar1 = ref_gather_plt_brick_zone
                                  (pRStack_18,pRStack_18->cell[0xb],scalar_local._4_4_,
                                   (REF_DBL *)scalar_names_local,(FILE *)_filetype);
                if (uVar1 == 0) {
                  if (0 < *(int *)&ref_node->age) {
                    ref_mpi_stopwatch_stop((REF_MPI)ref_node,"vol zone");
                  }
                  if (ref_node->max == 0) {
                    fclose(_filetype);
                  }
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x1101,"ref_gather_scalar_plt",(ulong)uVar1,"plt hex brick zone");
                  ref_grid_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x10fe,"ref_gather_scalar_plt",(ulong)uVar1,"plt pri brick zone");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x10fb,"ref_gather_scalar_plt",(ulong)uVar1,"plt pyr brick zone");
              ref_grid_local._4_4_ = uVar1;
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x10e0,"ref_gather_scalar_plt",(ulong)uVar1,"plt hex brick header");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10de,"ref_gather_scalar_plt",(ulong)uVar1,"plt pri brick header");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10dc,"ref_gather_scalar_plt",(ulong)uVar1,"plt pyr brick header");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10cb
           ,"ref_gather_scalar_plt",(ulong)uVar1,"range");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_plt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                REF_BOOL as_brick,
                                                const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file = NULL;
  int one = 1;
  int filetype = 0;
  int ascii[1024];
  int i, len, numvar = 3 + ldim;
  float eohmarker = 357.0;
  REF_INT cell_id, min_faceid, max_faceid;

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "reset timing");

  RSS(ref_node_synchronize_globals(ref_node), "sync");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header sync global");

  if (ref_mpi_once(ref_mpi)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(8, fwrite(&"#!TDV112", sizeof(char), 8, file), "header");
    REIS(1, fwrite(&one, sizeof(int), 1, file), "magic");
    REIS(1, fwrite(&filetype, sizeof(int), 1, file), "filetype");

    ascii[0] = (int)'f';
    ascii[1] = (int)'t';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&numvar, sizeof(int), 1, file), "numvar");
    ascii[0] = (int)'x';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'y';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'z';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    for (i = 0; i < ldim; i++) {
      len = 0;
      if (NULL == scalar_names) {
        char default_name[1000];
        snprintf(default_name, 1000, "V%d", i + 1);
        RSS(ref_gather_plt_char_int(default_name, 1024, &len, ascii), "a2i");
      } else {
        RSS(ref_gather_plt_char_int(scalar_names[i], 1024, &len, ascii), "a2i");
      }
      REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "var");
    }
  }

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vars");
  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header faceid range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_header(ref_grid, cell_id, file), "plt tri header");
    RSS(ref_gather_plt_qua_header(ref_grid, cell_id, file), "plt qua header");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header surf");
  if (as_brick) {
    RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_tet(ref_grid), file),
        "plt tet brick header");
  } else {
    RSS(ref_gather_plt_tet_header(ref_grid, file), "plt tet header");
  }
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pyr(ref_grid), file),
      "plt pyr brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pri(ref_grid), file),
      "plt pri brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_hex(ref_grid), file),
      "plt hex brick header");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vol");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&eohmarker, sizeof(float), 1, file), "eohmarker");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt end of header");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt tri zone");
    RSS(ref_gather_plt_qua_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt qua zone");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "surf zone");

  if (as_brick) {
    RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_tet(ref_grid), ldim,
                                  scalar, file),
        "plt tet brick zone");
  } else {
    RSS(ref_gather_plt_tet_zone(ref_grid, ldim, scalar, file), "surf zone");
  }
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pyr(ref_grid), ldim, scalar,
                                file),
      "plt pyr brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pri(ref_grid), ldim, scalar,
                                file),
      "plt pri brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_hex(ref_grid), ldim, scalar,
                                file),
      "plt hex brick zone");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "vol zone");

  if (ref_mpi_once(ref_mpi)) {
    fclose(file);
  }

  return REF_SUCCESS;
}